

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_set_obj_parent(hd_context *ctx,pdf_obj *obj,int num)

{
  int iVar1;
  pdf_obj *ppVar2;
  int local_24;
  int i;
  int n;
  int num_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  if ((pdf_obj *)0x188 < obj) {
    if (obj->kind == 'a') {
      obj[4].refs = (short)num;
      obj[4].kind = (char)((uint)num >> 0x10);
      obj[4].flags = (char)((uint)num >> 0x18);
      iVar1 = pdf_array_len(ctx,obj);
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        ppVar2 = pdf_array_get(ctx,obj,local_24);
        pdf_set_obj_parent(ctx,ppVar2,num);
      }
    }
    else if (obj->kind == 'd') {
      obj[4].refs = (short)num;
      obj[4].kind = (char)((uint)num >> 0x10);
      obj[4].flags = (char)((uint)num >> 0x18);
      iVar1 = pdf_dict_len(ctx,obj);
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        ppVar2 = pdf_dict_get_val(ctx,obj,local_24);
        pdf_set_obj_parent(ctx,ppVar2,num);
      }
    }
  }
  return;
}

Assistant:

void
pdf_set_obj_parent(hd_context *ctx, pdf_obj *obj, int num)
{
    int n, i;

    if (obj < PDF_OBJ__LIMIT)
        return;

    switch(obj->kind)
    {
        case PDF_ARRAY:
            ARRAY(obj)->parent_num = num;
            n = pdf_array_len(ctx, obj);
            for (i = 0; i < n; i++)
                pdf_set_obj_parent(ctx, pdf_array_get(ctx, obj, i), num);
            break;
        case PDF_DICT:
            DICT(obj)->parent_num = num;
            n = pdf_dict_len(ctx, obj);
            for (i = 0; i < n; i++)
                pdf_set_obj_parent(ctx, pdf_dict_get_val(ctx, obj, i), num);
            break;
    }
}